

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::MultiNode<QByteArray,QByteArray>::insertMulti<QByteArray_const&>
          (MultiNode<QByteArray,QByteArray> *this,QByteArray *args)

{
  Data *pDVar1;
  long lVar2;
  long *plVar3;
  
  plVar3 = (long *)operator_new(0x20);
  pDVar1 = (args->d).d;
  *plVar3 = (long)pDVar1;
  plVar3[1] = (long)(args->d).ptr;
  plVar3[2] = (args->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  lVar2 = *(long *)(this + 0x18);
  *(long **)(this + 0x18) = plVar3;
  plVar3[3] = lVar2;
  return;
}

Assistant:

void insertMulti(Args &&... args)
    {
        Chain *e = new Chain{ T(std::forward<Args>(args)...), nullptr };
        e->next = std::exchange(value, e);
    }